

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlElement.cpp
# Opt level: O2

uint64 libebml::ReadCodedSizeValue(binary *InBuffer,uint32 *BufferSize,uint64 *SizeUnknown)

{
  uint uVar1;
  long lVar2;
  uint64 uVar3;
  uint uVar4;
  uint32 uVar5;
  long lVar6;
  byte *pbVar7;
  ulong uVar8;
  bool bVar9;
  binary PossibleSize [8];
  
  PossibleSize[0] = '\0';
  PossibleSize[1] = '\0';
  PossibleSize[2] = '\0';
  PossibleSize[3] = '\0';
  PossibleSize[4] = '\0';
  PossibleSize[5] = '\0';
  PossibleSize[6] = '\0';
  PossibleSize[7] = '\0';
  *SizeUnknown = 0x7f;
  uVar1 = 8;
  if (*BufferSize < 8) {
    uVar1 = *BufferSize;
  }
  uVar8 = 0x7f;
  uVar5 = 0;
  lVar6 = 0;
  do {
    uVar4 = (uint)lVar6;
    if (uVar1 == uVar4) {
      uVar3 = 0;
LAB_0018ffd9:
      *BufferSize = uVar5;
      return uVar3;
    }
    if ((char)(*InBuffer << ((byte)lVar6 & 0x1f)) < '\0') {
      for (lVar2 = -1; lVar6 != lVar2; lVar2 = lVar2 + 1) {
        PossibleSize[lVar2 + 1] = InBuffer[lVar2 + 1];
      }
      pbVar7 = PossibleSize;
      uVar3 = (uint64)(-0x81 >> ((byte)lVar6 & 0x1f) & (uint)PossibleSize[0]);
      while (pbVar7 = pbVar7 + 1, bVar9 = lVar6 != 0, lVar6 = lVar6 + -1, bVar9) {
        uVar3 = uVar3 << 8 | (ulong)*pbVar7;
      }
      uVar5 = uVar4 + 1;
      goto LAB_0018ffd9;
    }
    uVar8 = uVar8 << 7 | 0xff;
    *SizeUnknown = uVar8;
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

uint64 ReadCodedSizeValue(const binary * InBuffer, uint32 & BufferSize, uint64 & SizeUnknown)
{
  binary SizeBitMask = 1 << 7;
  uint64 Result = 0x7F;
  unsigned int SizeIdx, PossibleSizeLength = 0;
  binary PossibleSize[8];
  memset(PossibleSize, 0, 8);

  SizeUnknown = 0x7F; // the last bit is discarded when computing the size
  for (SizeIdx = 0; SizeIdx < BufferSize && SizeIdx < 8; SizeIdx++) {
    if (InBuffer[0] & (SizeBitMask >> SizeIdx)) {
      // ID found
      PossibleSizeLength = SizeIdx + 1;
      SizeBitMask >>= SizeIdx;

      // Guard against invalid memory accesses with incomplete IDs.
      if (PossibleSizeLength > BufferSize)
        break;

      for (SizeIdx = 0; SizeIdx < PossibleSizeLength; SizeIdx++) {
        PossibleSize[SizeIdx] = InBuffer[SizeIdx];
      }
      for (SizeIdx = 0; SizeIdx < PossibleSizeLength - 1; SizeIdx++) {
        Result <<= 7;
        Result |= 0xFF;
      }

      Result = 0;
      Result |= PossibleSize[0] & ~SizeBitMask;
      for (unsigned int i = 1; i<PossibleSizeLength; i++) {
        Result <<= 8;
        Result |= PossibleSize[i];
      }

      BufferSize = PossibleSizeLength;

      return Result;
    }
    SizeUnknown <<= 7;
    SizeUnknown |= 0xFF;
  }

  BufferSize = 0;
  return 0;
}